

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

bool __thiscall
TPZMatrix<TPZFlopCounter>::SolveEigenvaluesJacobi
          (TPZMatrix<TPZFlopCounter> *this,int64_t *numiterations,REAL *tol,
          TPZVec<TPZFlopCounter> *Sort)

{
  _Rb_tree_header *p_Var1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  _Self __tmp;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  _Base_ptr p_Var13;
  TPZFlopCounter *pTVar14;
  ulong uVar15;
  ulong uVar16;
  int64_t iVar17;
  ulong uVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  multiset<double,_std::less<double>,_std::allocator<double>_> myset;
  double local_98;
  double local_68;
  _Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>
  local_60;
  
  TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 1;
  uVar10 = (this->super_TPZBaseMatrix).fRow;
  if (*numiterations < 1) {
    local_98 = *tol + *tol;
    iVar17 = 0;
  }
  else {
    uVar18 = 0xffffffffffffffff;
    iVar17 = 0;
    uVar19 = 0xffffffffffffffff;
    do {
      if ((long)uVar10 < 1) {
        local_98 = 0.0;
      }
      else {
        local_98 = 0.0;
        uVar15 = 0;
        do {
          if (uVar15 != 0) {
            uVar16 = 0;
            do {
              if (((this->super_TPZBaseMatrix).fRow <= (long)uVar15) ||
                 ((this->super_TPZBaseMatrix).fCol <= (long)uVar16)) {
                Error("TPZMatrix<TVar>::Operator()","Index out of range");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                           ,0x33d);
              }
              iVar11 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                                 (this,uVar15,uVar16);
              if (ABS(local_98) < ABS(*(double *)CONCAT44(extraout_var,iVar11))) {
                if (((this->super_TPZBaseMatrix).fRow <= (long)uVar15) ||
                   ((this->super_TPZBaseMatrix).fCol <= (long)uVar16)) {
                  Error("TPZMatrix<TVar>::Operator()","Index out of range");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                             ,0x33d);
                }
                iVar11 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                                   (this,uVar15,uVar16);
                local_98 = ABS(*(double *)CONCAT44(extraout_var_00,iVar11));
                uVar18 = uVar15;
                uVar19 = uVar16;
              }
              uVar16 = uVar16 + 1;
            } while (uVar15 != uVar16);
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar10);
      }
      if (ABS(local_98) < *tol) break;
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar18) || ((long)(uVar18 | uVar19) < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar19)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar11 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                         (this,uVar18,uVar19);
      dVar20 = *(double *)CONCAT44(extraout_var_01,iVar11);
      TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 1;
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar19) || ((long)uVar19 < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar19)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar11 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                         (this,uVar19,uVar19);
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar18) || ((long)uVar18 < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar18)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar12 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                         (this,uVar18,uVar18);
      TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
      TPZFlopCounter::gCount.fCount[2] = TPZFlopCounter::gCount.fCount[2] + 1;
      dVar20 = atan((dVar20 + dVar20) /
                    (*(double *)CONCAT44(extraout_var_02,iVar11) -
                    *(double *)CONCAT44(extraout_var_03,iVar12)));
      TPZFlopCounter::gCount.fCount[9] = TPZFlopCounter::gCount.fCount[9] + 1;
      TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 1;
      dVar21 = cos(dVar20 * 0.5);
      TPZFlopCounter::gCount.fCount[5] = TPZFlopCounter::gCount.fCount[5] + 1;
      dVar20 = sin(dVar20 * 0.5);
      TPZFlopCounter::gCount.fCount[6] = TPZFlopCounter::gCount.fCount[6] + 1;
      if (0 < (long)uVar10) {
        uVar15 = 0;
        do {
          if ((uVar18 != uVar15) && (uVar19 != uVar15)) {
            if (((this->super_TPZBaseMatrix).fRow <= (long)uVar15) ||
               (((long)uVar18 < 0 || ((this->super_TPZBaseMatrix).fCol <= (long)uVar18)))) {
              Error("TPZMatrix<TVar>::Operator()","Index out of range");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                         ,0x33d);
            }
            iVar11 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                               (this,uVar15,uVar18);
            dVar22 = *(double *)CONCAT44(extraout_var_04,iVar11);
            TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 1;
            if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar15) || ((long)uVar19 < 0)) ||
               ((this->super_TPZBaseMatrix).fCol <= (long)uVar19)) {
              Error("TPZMatrix<TVar>::Operator()","Index out of range");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                         ,0x33d);
            }
            iVar11 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                               (this,uVar15,uVar19);
            dVar2 = *(double *)CONCAT44(extraout_var_05,iVar11);
            TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
            TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 1;
            if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar15) || ((long)uVar18 < 0)) ||
               ((this->super_TPZBaseMatrix).fCol <= (long)uVar18)) {
              Error("TPZMatrix<TVar>::Operator()","Index out of range");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                         ,0x33d);
            }
            iVar11 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                               (this,uVar15,uVar18);
            dVar3 = *(double *)CONCAT44(extraout_var_06,iVar11);
            TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 1;
            if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar15) || ((long)uVar19 < 0)) ||
               ((this->super_TPZBaseMatrix).fCol <= (long)uVar19)) {
              Error("TPZMatrix<TVar>::Operator()","Index out of range");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                         ,0x33d);
            }
            iVar11 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                               (this,uVar15,uVar19);
            dVar4 = *(double *)CONCAT44(extraout_var_07,iVar11);
            TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
            TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 1;
            if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar15) || ((long)uVar18 < 0)) ||
               ((this->super_TPZBaseMatrix).fCol <= (long)uVar18)) {
              Error("TPZMatrix<TVar>::Operator()","Index out of range");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                         ,0x33d);
            }
            dVar22 = dVar22 * dVar21 - dVar2 * dVar20;
            iVar11 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                               (this,uVar15,uVar18);
            *(double *)CONCAT44(extraout_var_08,iVar11) = dVar22;
            if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar18) || ((long)uVar18 < 0)) ||
               ((this->super_TPZBaseMatrix).fCol <= (long)uVar15)) {
              Error("TPZMatrix<TVar>::Operator()","Index out of range");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                         ,0x33d);
            }
            iVar11 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                               (this,uVar18,uVar15);
            *(double *)CONCAT44(extraout_var_09,iVar11) = dVar22;
            if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar15) || ((long)uVar19 < 0)) ||
               ((this->super_TPZBaseMatrix).fCol <= (long)uVar19)) {
              Error("TPZMatrix<TVar>::Operator()","Index out of range");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                         ,0x33d);
            }
            dVar22 = dVar3 * dVar20 + dVar4 * dVar21;
            iVar11 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                               (this,uVar15,uVar19);
            *(double *)CONCAT44(extraout_var_10,iVar11) = dVar22;
            if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar19) || ((long)uVar19 < 0)) ||
               ((this->super_TPZBaseMatrix).fCol <= (long)uVar15)) {
              Error("TPZMatrix<TVar>::Operator()","Index out of range");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                         ,0x33d);
            }
            iVar11 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                               (this,uVar19,uVar15);
            *(double *)CONCAT44(extraout_var_11,iVar11) = dVar22;
          }
          uVar15 = uVar15 + 1;
        } while (uVar10 != uVar15);
      }
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar18) || ((long)uVar18 < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar18)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar11 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                         (this,uVar18,uVar18);
      dVar22 = *(double *)CONCAT44(extraout_var_12,iVar11);
      TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 2;
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar18) || ((long)(uVar18 | uVar19) < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar19)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar11 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                         (this,uVar18,uVar19);
      dVar2 = *(double *)CONCAT44(extraout_var_13,iVar11);
      TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
      TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 3;
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar19) || ((long)uVar19 < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar19)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar11 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                         (this,uVar19,uVar19);
      dVar3 = *(double *)CONCAT44(extraout_var_14,iVar11);
      TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
      TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 2;
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar18) || ((long)uVar18 < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar18)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar11 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                         (this,uVar18,uVar18);
      dVar4 = *(double *)CONCAT44(extraout_var_15,iVar11);
      TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 2;
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar18) || ((long)(uVar18 | uVar19) < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar19)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar11 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                         (this,uVar18,uVar19);
      dVar5 = *(double *)CONCAT44(extraout_var_16,iVar11);
      TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
      TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 3;
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar19) || ((long)uVar19 < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar19)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar11 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                         (this,uVar19,uVar19);
      dVar6 = *(double *)CONCAT44(extraout_var_17,iVar11);
      TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
      TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 2;
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar18) || ((long)uVar18 < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar18)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar11 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                         (this,uVar18,uVar18);
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar19) || ((long)uVar19 < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar19)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar12 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                         (this,uVar19,uVar19);
      dVar7 = *(double *)CONCAT44(extraout_var_18,iVar11);
      dVar8 = *(double *)CONCAT44(extraout_var_19,iVar12);
      TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
      TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 2;
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar18) || ((long)(uVar18 | uVar19) < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar19)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar11 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                         (this,uVar18,uVar19);
      dVar9 = *(double *)CONCAT44(extraout_var_20,iVar11);
      TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 3;
      TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 2;
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar18) || ((long)uVar18 < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar18)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar11 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                         (this,uVar18,uVar18);
      *(double *)CONCAT44(extraout_var_21,iVar11) =
           dVar3 * dVar20 * dVar20 + (dVar22 * dVar21 * dVar21 - (dVar2 + dVar2) * dVar20 * dVar21);
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar19) || ((long)uVar19 < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar19)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar11 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                         (this,uVar19,uVar19);
      *(double *)CONCAT44(extraout_var_22,iVar11) =
           dVar6 * dVar21 * dVar21 + (dVar5 + dVar5) * dVar20 * dVar21 + dVar4 * dVar20 * dVar20;
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar18) || ((long)(uVar18 | uVar19) < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar19)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      dVar20 = dVar20 * dVar21 * (dVar7 - dVar8) + (dVar21 * dVar21 - dVar20 * dVar20) * dVar9;
      iVar11 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                         (this,uVar18,uVar19);
      *(double *)CONCAT44(extraout_var_23,iVar11) = dVar20;
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar19) || ((long)(uVar18 | uVar19) < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar18)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar11 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                         (this,uVar19,uVar18);
      *(double *)CONCAT44(extraout_var_24,iVar11) = dVar20;
      iVar17 = iVar17 + 1;
    } while (iVar17 < *numiterations);
  }
  if (Sort != (TPZVec<TPZFlopCounter> *)0x0) {
    p_Var1 = &local_60._M_impl.super__Rb_tree_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    if (0 < (long)uVar10) {
      uVar18 = 0;
      do {
        if (((this->super_TPZBaseMatrix).fRow <= (long)uVar18) ||
           ((this->super_TPZBaseMatrix).fCol <= (long)uVar18)) {
          Error("TPZMatrix<TVar>::Operator()","Index out of range");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                     ,0x33d);
        }
        iVar11 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                           (this,uVar18,uVar18);
        local_68 = *(double *)CONCAT44(extraout_var_25,iVar11);
        std::
        _Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>
        ::_M_insert_equal<double>(&local_60,&local_68);
        uVar18 = uVar18 + 1;
      } while (uVar10 != uVar18);
    }
    (*Sort->_vptr_TPZVec[3])(Sort,uVar10);
    if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
      pTVar14 = Sort->fStore + uVar10;
      p_Var13 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        pTVar14 = pTVar14 + -1;
        pTVar14->fVal = *(REAL *)(p_Var13 + 1);
        p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
      } while ((_Rb_tree_header *)p_Var13 != p_Var1);
    }
    std::
    _Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>::
    ~_Rb_tree(&local_60);
  }
  dVar20 = *tol;
  *tol = ABS(local_98);
  *numiterations = iVar17;
  return ABS(local_98) < dVar20;
}

Assistant:

bool TPZMatrix<TVar>::SolveEigenvaluesJacobi(int64_t &numiterations, REAL & tol, TPZVec<TVar> * Sort){
	
#ifdef PZDEBUG2
	if (this->Rows() != this->Cols()){
		PZError << __PRETTY_FUNCTION__ << " - Jacobi method of computing eigenvalues requires a symmetric square matrix. this->Rows = " << this->Rows() << " - this->Cols() = " << this->Cols() << endl;
		return false;
	}
	
	if (this->VerifySymmetry(1.e-8) == false){
		PZError << __PRETTY_FUNCTION__ << " - Jacobi method of computing eigenvalues requires a symmetric square matrix. This matrix is not symmetric." << endl;
		return false;
	}
#endif
	
	int64_t iter = 0;
	TVar res = (TVar)2. * (TVar)tol;
	const int64_t size = this->Rows();
	int64_t i, j;
	int64_t p = -1, q = -1;
	TVar maxval, theta, cost, sint, aux, aux2, Spp, Sqq, Spq;
	while (iter < numiterations){
		/** First of all find the max value off diagonal */
		maxval = 0.;
		for(i = 0; i < size; i++){
			for(j = 0; j < i; j++) {
				if( fabs(this->operator ( )(i,j) ) > fabs(maxval) ) {
					p = i;
					q = j;
					maxval = fabs( this->operator ( )(i,j) );
				}//if
			}//for j
		}//for i
		
		/** Check if max value off diagonal is lesser than required tolerance */
		res = maxval;
		if ((REAL)(fabs(res)) < tol) break;
		
		/** Compute angle of rotation */
		theta = (TVar)0.5 * atan((TVar)2. * this->operator ( )(p,q) / (this->operator ( )(q,q) - this->operator ( )(p,p) ) );
		cost = cos(theta);
		sint = sin(theta);
		
		/** Apply rotation */
		for(i = 0; i < size; i++){
			if (i != p && i != q){
				
				aux = this->operator ( )(i,p) * (TVar)cost - this->operator ( )(i,q) * (TVar)sint;
				aux2 = this->operator ( )(i,p) * (TVar)sint + this->operator ( )(i,q) * (TVar)cost;
				
				this->operator ( )(i,p) = aux;
				this->operator ( )(p,i) = aux;
				
				this->operator ( )(i,q) = aux2;
				this->operator ( )(q,i) = aux2;
				
			}//if
		}//for i
		
		Spp = this->operator ( )(p,p) * cost * cost -(TVar)2. * this->operator ( )(p,q) * sint * cost + this->operator ( )(q,q) * sint * sint;
		Sqq = this->operator ( )(p,p) * sint * sint +(TVar)2. * this->operator ( )(p,q) * sint * cost + this->operator ( )(q,q) * cost * cost;
		Spq = ( this->operator ( )(p,p) - this->operator ( )(q,q) ) * cost * sint + this->operator ( )(p,q)*( cost*cost - sint*sint );
		
		this->operator ( )(p,p) = Spp;
		this->operator ( )(q,q) = Sqq;
		this->operator ( )(p,q) = Spq;
		this->operator ( )(q,p) = Spq;
		
		iter++;
	}//while
	
	/** Sorting */
	if (Sort){
		multiset< REAL > myset;
		for(i = 0; i < size; i++)
        {   TVar exps = this->operator ( )(i,i);
            myset.insert( (TPZExtractVal::val(exps)) );
        }
		
#ifdef PZDEBUG2
		if ((int64_t)myset.size() != size) PZError << __PRETTY_FUNCTION__ << " - ERROR!" << endl;
#endif
		
		Sort->Resize(size);
		multiset< REAL >::iterator w, e = myset.end();
		for(i = size - 1, w = myset.begin(); w != e; w++, i--){
			Sort->operator [ ](i) = *w;
		}//for
	}//if (Sort)
	
	
	if ((REAL)(fabs(res)) < tol){
		tol = fabs(res);
		numiterations = iter;
		return true;
	}
	
	tol = fabs(res);
	numiterations = iter;
	return false;
	
}